

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  alpnid srcalpnid_00;
  _Bool _Var3;
  byte bVar4;
  unsigned_short uVar5;
  int iVar6;
  alpnid dstalpnid;
  size_t sVar7;
  altsvc *p;
  time_t tVar8;
  bool bVar9;
  byte *pbVar10;
  char *pcVar11;
  ulong uVar12;
  byte *__nptr;
  byte *pbVar13;
  ulong uVar14;
  byte *pbVar15;
  size_t sVar16;
  bool bVar17;
  char alpnbuf [10];
  char *end_ptr;
  char option [32];
  uint local_c0;
  undefined4 local_b4;
  char local_b0 [16];
  byte *local_a0;
  byte *local_98;
  long local_90;
  byte *local_88;
  altsvcinfo *local_80;
  ulong local_78;
  size_t local_70;
  Curl_llist *local_68;
  Curl_easy *local_60;
  char local_58 [40];
  
  local_b0[8] = '\0';
  local_b0[9] = '\0';
  local_b0[0] = '\0';
  local_b0[1] = '\0';
  local_b0[2] = '\0';
  local_b0[3] = '\0';
  local_b0[4] = '\0';
  local_b0[5] = '\0';
  local_b0[6] = '\0';
  local_b0[7] = '\0';
  for (; (bVar4 = *value, bVar4 == 9 || (bVar4 == 0x20)); value = (char *)((byte *)value + 1)) {
  }
  uVar12 = 0;
  while ((0x3d < bVar4 || ((0x2800000100000201U >> ((ulong)bVar4 & 0x3f) & 1) == 0))) {
    bVar4 = ((byte *)value)[uVar12 + 1];
    uVar12 = uVar12 + 1;
  }
  if (uVar12 == 0 || 9 < uVar12) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      Curl_infof(data,"Excessive alt-svc header, ignoring.");
    }
  }
  else {
    local_b4 = srcalpnid;
    local_80 = asi;
    memcpy(local_b0,value,uVar12);
    local_b0[uVar12] = '\0';
    iVar6 = curl_strequal(local_b0,"clear");
    if (iVar6 == 0) {
      pbVar15 = (byte *)value + uVar12;
      uVar12 = (ulong)*pbVar15;
      local_68 = &local_80->list;
      local_90 = 0;
      local_c0 = (uint)srcport;
      local_98 = (byte *)srchost;
      local_60 = data;
      while (((char)uVar12 == '=' &&
             (dstalpnid = alpn2alpnid(local_b0), pbVar13 = local_98, pbVar15[1] == 0x22))) {
        pbVar10 = pbVar15 + 2;
        bVar4 = pbVar15[2];
        __nptr = pbVar10;
        if (bVar4 == 0) {
LAB_00110fd4:
          sVar16 = (long)__nptr - (long)pbVar10;
LAB_00110fda:
          bVar17 = sVar16 - 1 < 0x1ff;
          if (!bVar17) {
            pbVar10 = (byte *)0x17d8ab;
          }
          if (data != (Curl_easy *)0x0 && !bVar17) {
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                (0 < pcVar1->log_level)))) {
              Curl_infof(data,"Excessive alt-svc hostname, ignoring.");
            }
            bVar17 = false;
            pbVar10 = (byte *)0x17d8ab;
          }
          bVar4 = *__nptr;
          pbVar15 = __nptr;
          local_88 = pbVar10;
          local_70 = sVar16;
          if (bVar4 == 0x3a) goto LAB_00111063;
        }
        else {
          if (bVar4 != 0x3a) {
            if (bVar4 != 0x5b) {
              do {
                if ((0x19 < (byte)(bVar4 + 0x9f) && 9 < (byte)(bVar4 - 0x30)) &&
                   (0x19 < (byte)(bVar4 + 0xbf) && 1 < (byte)(bVar4 - 0x2d))) break;
                bVar4 = __nptr[1];
                __nptr = __nptr + 1;
              } while (bVar4 != 0);
              goto LAB_00110fd4;
            }
            sVar7 = strspn((char *)(pbVar15 + 3),"0123456789abcdefABCDEF:.");
            if (pbVar15[sVar7 + 3] != 0x5d) {
              return CURLE_OK;
            }
            sVar16 = sVar7 + 2;
            __nptr = pbVar15 + sVar7 + 4;
            goto LAB_00110fda;
          }
          sVar16 = strlen((char *)local_98);
          bVar17 = true;
          local_88 = pbVar13;
          pbVar15 = pbVar10;
LAB_00111063:
          __nptr = pbVar15 + 1;
          pbVar13 = __nptr;
          local_70 = sVar16;
          if (((((byte)(pbVar15[1] - 0x30) < 10) &&
               (uVar12 = strtoul((char *)__nptr,(char **)&local_a0,10), pbVar15 = local_a0,
               pbVar13 = local_a0, 0xffffffffffff0000 < uVar12 - 0x10000)) && (local_a0 != __nptr))
             && (*local_a0 == 0x22)) {
            uVar5 = curlx_ultous(uVar12);
            local_c0 = (uint)uVar5;
            __nptr = pbVar15;
          }
          else {
            local_a0 = pbVar13;
            if (((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) ||
               ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 &&
                (pcVar1->log_level < 1)))) {
              bVar17 = false;
            }
            else {
              bVar17 = false;
              Curl_infof(data,"Unknown alt-svc port number, ignoring.");
            }
          }
          bVar4 = *__nptr;
        }
        if (bVar4 != 0x22) {
          return CURLE_OK;
        }
        pbVar15 = __nptr + 1;
        local_78 = 0x15180;
        bVar9 = false;
        uVar12 = local_78;
        _Var3 = false;
LAB_0011111f:
        _Var2 = _Var3;
        local_78 = uVar12;
        data = local_60;
        srcalpnid_00 = local_b4;
        pbVar13 = pbVar15 + 2;
        while( true ) {
          pbVar10 = pbVar15 + 1;
          bVar4 = *pbVar15;
          if ((bVar4 != 9) && (bVar4 != 0x20)) break;
          pbVar13 = pbVar13 + 1;
          pbVar15 = pbVar10;
        }
        if (bVar4 == 0x3b) {
          bVar4 = *pbVar10;
          uVar12 = (ulong)bVar4;
          if ((0xd < bVar4) || (pbVar15 = pbVar10, (0x2401U >> (bVar4 & 0x1f) & 1) == 0)) {
            while (((char)uVar12 == '\t' || ((int)uVar12 == 0x20))) {
              pbVar15 = pbVar10 + 1;
              pbVar10 = pbVar10 + 1;
              pbVar13 = pbVar13 + 1;
              uVar12 = (ulong)*pbVar15;
            }
            uVar14 = 0;
            while ((0x3d < (byte)uVar12 || ((0x2800000100000201U >> (uVar12 & 0x3f) & 1) == 0))) {
              bVar4 = *pbVar13;
              uVar14 = uVar14 + 1;
              pbVar13 = pbVar13 + 1;
              uVar12 = (ulong)bVar4;
            }
            if (uVar14 < 0x20 && uVar14 != 0) {
              memcpy(local_58,pbVar10,uVar14);
              local_58[uVar14] = '\0';
            }
            else {
              local_58[0] = '\0';
            }
            for (pbVar10 = pbVar10 + uVar14; (bVar4 = *pbVar10, bVar4 == 9 || (bVar4 == 0x20));
                pbVar10 = pbVar10 + 1) {
              pbVar13 = pbVar13 + 1;
            }
            if (bVar4 != 0x3d) {
              return CURLE_OK;
            }
            do {
              bVar4 = *pbVar13;
              if (bVar4 < 0x20) {
                if (bVar4 != 9) goto LAB_00111215;
              }
              else if (bVar4 != 0x20) {
                if (bVar4 != 0x22) goto LAB_00111229;
                pbVar13 = pbVar13 + 1;
                pbVar10 = pbVar13;
                goto LAB_0011123f;
              }
              pbVar13 = pbVar13 + 1;
            } while( true );
          }
        }
        if (!(bool)(bVar17 ^ 1U | dstalpnid == ALPN_none)) {
          if (local_90 == 0) {
            altsvc_flush(local_80,local_b4,(char *)local_98,srcport);
          }
          local_90 = local_90 + 1;
          p = altsvc_createid((char *)local_98,(char *)local_88,local_70,srcalpnid_00,dstalpnid,
                              (uint)srcport,local_c0);
          if (p != (altsvc *)0x0) {
            tVar8 = time((time_t *)0x0);
            p->expires = tVar8 + local_78;
            p->persist = _Var2;
            Curl_llist_append(local_68,p,&p->node);
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                (0 < pcVar1->log_level)))) {
              pcVar11 = "h1";
              if (dstalpnid != ALPN_h1) {
                if (dstalpnid == ALPN_h3) {
                  pcVar11 = "h3";
                }
                else if (dstalpnid == ALPN_h2) {
                  pcVar11 = "h2";
                }
                else {
                  pcVar11 = "";
                }
              }
              Curl_infof(data,"Added alt-svc: %s:%d over %s",local_88,(ulong)local_c0,pcVar11);
            }
          }
        }
        bVar4 = *pbVar15;
        if (bVar4 == 0x2c) {
          do {
            do {
              pbVar13 = pbVar15;
              pbVar10 = pbVar13 + 1;
              bVar4 = pbVar13[1];
              pbVar15 = pbVar10;
            } while (bVar4 == 9);
          } while (bVar4 == 0x20);
          uVar12 = 1;
          while ((0x3d < bVar4 || ((0x2800000100000201U >> ((ulong)bVar4 & 0x3f) & 1) == 0))) {
            bVar4 = pbVar13[uVar12 + 1];
            uVar12 = uVar12 + 1;
          }
          if (uVar12 == 1) {
            return CURLE_OK;
          }
          if (10 < uVar12) {
            return CURLE_OK;
          }
          pbVar15 = pbVar13 + uVar12;
          memcpy(local_b0,pbVar10,uVar12 - 1);
          *(undefined1 *)((long)&local_b4 + uVar12 + 3) = 0;
          bVar4 = pbVar13[uVar12];
        }
        uVar12 = (ulong)bVar4;
        if ((bVar4 < 0x3c) && ((0x800000000002401U >> (uVar12 & 0x3f) & 1) != 0)) {
          return CURLE_OK;
        }
      }
    }
    else {
      altsvc_flush(local_80,local_b4,srchost,srcport);
    }
  }
  return CURLE_OK;
LAB_00111215:
  if (bVar4 == 0) {
    return CURLE_OK;
  }
LAB_00111229:
  pbVar15 = pbVar13;
  pbVar10 = pbVar13;
  if (bVar9) {
LAB_0011123f:
    do {
      pbVar15 = pbVar10 + 1;
      bVar4 = *pbVar10;
      if (bVar4 == 0) break;
      pbVar10 = pbVar15;
    } while (bVar4 != 0x22);
    bVar9 = true;
    if (bVar4 == 0) {
      return CURLE_OK;
    }
  }
  else {
    while ((0x3b < (ulong)*pbVar15 || ((0x800100100000201U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0)))
    {
      pbVar15 = pbVar15 + 1;
    }
  }
  uVar14 = strtoul((char *)pbVar13,(char **)&local_a0,10);
  uVar12 = local_78;
  _Var3 = _Var2;
  if (uVar14 != 0xffffffffffffffff && local_a0 != pbVar13) {
    iVar6 = curl_strequal("ma",local_58);
    uVar12 = uVar14;
    if (iVar6 == 0) {
      iVar6 = curl_strequal("persist",local_58);
      if (uVar14 == 1) {
        _Var3 = true;
      }
      uVar12 = local_78;
      if (iVar6 == 0) {
        _Var3 = _Var2;
      }
    }
  }
  goto LAB_0011111f;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        size_t dstlen = 0; /* destination hostname length */
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            dstlen = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[dstlen] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            dstlen += 2;
            p = &p[dstlen-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            dstlen = p - hostp;
          }
          if(!dstlen || (dstlen >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            dsthost = hostp;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
          dstlen = strlen(srchost);
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost, dstlen,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}